

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pit.c
# Opt level: O1

void ndn_pit_unregister_face(ndn_pit_t *self,ndn_table_id_t face_id)

{
  ndn_table_id_t id;
  byte bVar1;
  nametree_entry_t *pnVar2;
  ndn_nametree_t *pnVar3;
  ulong uVar4;
  ndn_pit_t *pnVar5;
  
  if (self->capacity != 0) {
    bVar1 = (byte)face_id & 0x3f;
    pnVar5 = self + 2;
    uVar4 = 0;
    do {
      id = pnVar5[3].capacity;
      pnVar3 = (ndn_nametree_t *)
               ((ulong)pnVar5->nametree & (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1));
      pnVar5->nametree = pnVar3;
      if (((pnVar3 == (ndn_nametree_t *)0x0 && id != 0xffff) &&
          (pnVar5[2].nametree == (ndn_nametree_t *)0x0)) && (*(long *)&pnVar5[2].capacity == 0)) {
        pnVar2 = ndn_nametree_at(self->nametree,id);
        pnVar2->pit_id = 0xffff;
        pnVar5[3].capacity = 0xffff;
        pnVar5[2].nametree = (ndn_nametree_t *)0x0;
        *(undefined8 *)&pnVar5[2].capacity = 0;
        pnVar5[1].nametree = (ndn_nametree_t *)0x0;
        *(undefined8 *)&pnVar5[1].capacity = 0;
        pnVar5->nametree = (ndn_nametree_t *)0x0;
        *(undefined8 *)&pnVar5->capacity = 0;
        pnVar5[3].nametree = (ndn_nametree_t *)0x0;
      }
      uVar4 = uVar4 + 1;
      pnVar5 = pnVar5 + 5;
    } while (uVar4 < self->capacity);
  }
  return;
}

Assistant:

void
ndn_pit_unregister_face(ndn_pit_t* self, ndn_table_id_t face_id){
  for (ndn_table_id_t i = 0; i < self->capacity; ++i){
    self->slots[i].incoming_faces = bitset_unset(self->slots[i].incoming_faces, face_id);
    ndn_pit_remove_entry_if_empty(self, &self->slots[i]);
  }
}